

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O2

shared_handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
::lock_shared(shared_handle *__return_storage_ptr__,
             shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
             *this)

{
  bool bVar1;
  shared_lock<std::shared_mutex> local_18;
  
  bVar1 = this->enabled;
  __return_storage_ptr__->data = &this->m_obj;
  if (bVar1 == true) {
    std::shared_lock<std::shared_mutex>::shared_lock
              (&__return_storage_ptr__->m_handle_lock,&this->m_mutex);
  }
  else {
    (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)0x0;
    local_18._M_pm = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_owns = false;
    std::shared_lock<std::shared_mutex>::~shared_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::lock_shared() const -> shared_handle
{
    return (enabled) ?
        shared_handle(&m_obj, m_mutex) :
        shared_handle(&m_obj, typename shared_locker<M>::locker_type{});
}